

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::LRNLayerParams::Clear(LRNLayerParams *this)

{
  uint32_t cached_has_bits;
  LRNLayerParams *this_local;
  
  memset(&this->alpha_,0,0x14);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void LRNLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.LRNLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&alpha_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&k_) -
      reinterpret_cast<char*>(&alpha_)) + sizeof(k_));
  _internal_metadata_.Clear<std::string>();
}